

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::BVHNIntersector1<8,_16781328,_false,_embree::avx512::VirtualCurveIntersector1>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  bool bVar9;
  float fVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  undefined1 auVar15 [12];
  byte bVar16;
  uint uVar17;
  long lVar18;
  byte bVar19;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar20) [32];
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  int iVar56;
  int iVar57;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar59;
  int iVar60;
  int iVar61;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar32 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  int iVar58;
  int iVar62;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined4 uVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  vfloat4 a0;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_23b8 [4];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [16];
  undefined1 local_2388 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    aVar8 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar32 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
    auVar15 = ZEXT812(0) << 0x20;
    auVar30 = ZEXT816(0) << 0x40;
    auVar67._4_12_ = auVar15;
    auVar67._0_4_ = auVar32._0_4_;
    auVar28 = vrsqrt14ss_avx512f(auVar30,auVar67);
    fVar63 = auVar28._0_4_;
    local_23b8[0] = fVar63 * 1.5 - auVar32._0_4_ * 0.5 * fVar63 * fVar63 * fVar63;
    uVar2 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    auVar74._0_4_ = aVar8.x * local_23b8[0];
    auVar74._4_4_ = aVar8.y * local_23b8[0];
    auVar74._8_4_ = aVar8.z * local_23b8[0];
    auVar74._12_4_ = aVar8.field_3.w * local_23b8[0];
    auVar28 = vshufpd_avx(auVar74,auVar74,1);
    auVar32 = vmovshdup_avx(auVar74);
    auVar65._8_4_ = 0x80000000;
    auVar65._0_8_ = 0x8000000080000000;
    auVar65._12_4_ = 0x80000000;
    auVar40._16_4_ = 0x80000000;
    auVar40._0_16_ = auVar65;
    auVar40._20_4_ = 0x80000000;
    auVar40._24_4_ = 0x80000000;
    auVar40._28_4_ = 0x80000000;
    auVar77._0_4_ = auVar32._0_4_ ^ 0x80000000;
    auVar32 = vunpckhps_avx(auVar74,auVar30);
    auVar77._4_12_ = auVar15;
    auVar31 = vshufps_avx(auVar32,auVar77,0x41);
    auVar75._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
    auVar75._8_8_ = auVar28._8_8_ ^ auVar65._8_8_;
    auVar29 = vinsertps_avx(auVar75,auVar74,0x2a);
    auVar32 = vdpps_avx(auVar31,auVar31,0x7f);
    auVar28 = vdpps_avx(auVar29,auVar29,0x7f);
    uVar11 = vcmpps_avx512vl(auVar28,auVar32,1);
    auVar32 = vpmovm2d_avx512vl(uVar11);
    auVar78._0_4_ = auVar32._0_4_;
    auVar78._4_4_ = auVar78._0_4_;
    auVar78._8_4_ = auVar78._0_4_;
    auVar78._12_4_ = auVar78._0_4_;
    uVar25 = vpmovd2m_avx512vl(auVar78);
    auVar32 = vpcmpeqd_avx(auVar78,auVar78);
    auVar28._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar32._4_4_;
    auVar28._0_4_ = (uint)((byte)uVar25 & 1) * auVar32._0_4_;
    auVar28._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar32._8_4_;
    auVar28._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar32._12_4_;
    auVar32 = vblendvps_avx(auVar29,auVar31,auVar28);
    auVar28 = vdpps_avx(auVar32,auVar32,0x7f);
    auVar79._4_12_ = auVar15;
    auVar79._0_4_ = auVar28._0_4_;
    auVar29 = vrsqrt14ss_avx512f(auVar30,auVar79);
    fVar63 = auVar29._0_4_;
    fVar63 = fVar63 * 1.5 - auVar28._0_4_ * 0.5 * fVar63 * fVar63 * fVar63;
    auVar76._0_4_ = auVar32._0_4_ * fVar63;
    auVar76._4_4_ = auVar32._4_4_ * fVar63;
    auVar76._8_4_ = auVar32._8_4_ * fVar63;
    auVar76._12_4_ = auVar32._12_4_ * fVar63;
    auVar32 = vshufps_avx(auVar76,auVar76,0xc9);
    auVar28 = vshufps_avx(auVar74,auVar74,0xc9);
    auVar80._0_4_ = auVar76._0_4_ * auVar28._0_4_;
    auVar80._4_4_ = auVar76._4_4_ * auVar28._4_4_;
    auVar80._8_4_ = auVar76._8_4_ * auVar28._8_4_;
    auVar80._12_4_ = auVar76._12_4_ * auVar28._12_4_;
    auVar32 = vfmsub231ps_fma(auVar80,auVar74,auVar32);
    auVar28 = vshufps_avx(auVar32,auVar32,0xc9);
    auVar32 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar81 = ZEXT1664(auVar32);
    auVar68._4_12_ = auVar15;
    auVar68._0_4_ = auVar32._0_4_;
    auVar29 = vrsqrt14ss_avx512f(auVar30,auVar68);
    fVar63 = auVar29._0_4_;
    fVar63 = fVar63 * 1.5 - auVar32._0_4_ * 0.5 * fVar63 * fVar63 * fVar63;
    auVar69._0_4_ = auVar28._0_4_ * fVar63;
    auVar69._4_4_ = auVar28._4_4_ * fVar63;
    auVar69._8_4_ = auVar28._8_4_ * fVar63;
    auVar69._12_4_ = auVar28._12_4_ * fVar63;
    auVar32._0_4_ = local_23b8[0] * auVar74._0_4_;
    auVar32._4_4_ = local_23b8[0] * auVar74._4_4_;
    auVar32._8_4_ = local_23b8[0] * auVar74._8_4_;
    auVar32._12_4_ = local_23b8[0] * auVar74._12_4_;
    auVar29 = vunpcklps_avx(auVar76,auVar32);
    auVar32 = vunpckhps_avx(auVar76,auVar32);
    auVar31 = vunpcklps_avx(auVar69,auVar30);
    auVar28 = vunpckhps_avx(auVar69,auVar30);
    local_2388 = vunpcklps_avx(auVar32,auVar28);
    local_23a8 = vunpcklps_avx(auVar29,auVar31);
    local_2398 = vunpckhps_avx(auVar29,auVar31);
    puVar22 = local_2368;
    auVar32 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar28 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar29 = vandps_avx512vl((undefined1  [16])aVar8,auVar29);
    auVar73._8_4_ = 0x219392ef;
    auVar73._0_8_ = 0x219392ef219392ef;
    auVar73._12_4_ = 0x219392ef;
    uVar25 = vcmpps_avx512vl(auVar29,auVar73,1);
    bVar9 = (bool)((byte)uVar25 & 1);
    auVar30._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar8.x;
    bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
    auVar30._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar8.y;
    bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
    auVar30._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar8.z;
    bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
    auVar30._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * aVar8.field_3.a;
    auVar29 = vrcp14ps_avx512vl(auVar30);
    auVar31._8_4_ = 0x3f800000;
    auVar31._0_8_ = 0x3f8000003f800000;
    auVar31._12_4_ = 0x3f800000;
    auVar31 = vfnmadd213ps_avx512vl(auVar30,auVar29,auVar31);
    local_2370[0] = 0;
    auVar30 = vfmadd132ps_fma(auVar31,auVar29,auVar29);
    uVar5 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uVar6 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    uVar7 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar33 = vbroadcastss_avx512vl(auVar30);
    auVar29 = vmovshdup_avx(auVar30);
    auVar34 = vbroadcastsd_avx512vl(auVar29);
    auVar31 = vshufpd_avx(auVar30,auVar30,1);
    auVar36._8_4_ = 2;
    auVar36._0_8_ = 0x200000002;
    auVar36._12_4_ = 2;
    auVar36._16_4_ = 2;
    auVar36._20_4_ = 2;
    auVar36._24_4_ = 2;
    auVar36._28_4_ = 2;
    auVar35 = vpermps_avx512vl(auVar36,ZEXT1632(auVar30));
    fVar63 = auVar30._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar37._4_4_ = fVar63;
    auVar37._0_4_ = fVar63;
    auVar37._8_4_ = fVar63;
    auVar37._12_4_ = fVar63;
    auVar37._16_4_ = fVar63;
    auVar37._20_4_ = fVar63;
    auVar37._24_4_ = fVar63;
    auVar37._28_4_ = fVar63;
    auVar38._8_4_ = 1;
    auVar38._0_8_ = 0x100000001;
    auVar38._12_4_ = 1;
    auVar38._16_4_ = 1;
    auVar38._20_4_ = 1;
    auVar38._24_4_ = 1;
    auVar38._28_4_ = 1;
    auVar39 = ZEXT1632(CONCAT412(auVar30._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar30._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar30._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar63))
                                ));
    auVar38 = vpermps_avx2(auVar38,auVar39);
    auVar39 = vpermps_avx2(auVar36,auVar39);
    uVar25 = (ulong)(auVar30._0_4_ < 0.0);
    uVar23 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x40;
    uVar24 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x80;
    uVar21 = uVar25 * 0x20 ^ 0x20;
    auVar36 = vbroadcastss_avx512vl(auVar32);
    uVar70 = auVar28._0_4_;
    auVar64 = ZEXT3264(CONCAT428(uVar70,CONCAT424(uVar70,CONCAT420(uVar70,CONCAT416(uVar70,CONCAT412
                                                  (uVar70,CONCAT48(uVar70,CONCAT44(uVar70,uVar70))))
                                                  ))));
    auVar37 = vxorps_avx512vl(auVar37,auVar40);
    auVar38 = vxorps_avx512vl(auVar38,auVar40);
    auVar39 = vxorps_avx512vl(auVar39,auVar40);
    auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar83 = ZEXT3264(auVar40);
    auVar40 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar84 = ZEXT3264(auVar40);
    do {
      pfVar1 = (float *)(puVar22 + -1);
      puVar22 = puVar22 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar26 = *puVar22;
        while ((uVar26 & 8) == 0) {
          fVar63 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar17 = (uint)uVar26 & 7;
          pauVar20 = (undefined1 (*) [32])(uVar26 & 0xfffffffffffffff0);
          if (uVar17 == 3) {
            auVar46._4_4_ = fVar63;
            auVar46._0_4_ = fVar63;
            auVar46._8_4_ = fVar63;
            auVar46._12_4_ = fVar63;
            auVar46._16_4_ = fVar63;
            auVar46._20_4_ = fVar63;
            auVar46._24_4_ = fVar63;
            auVar46._28_4_ = fVar63;
            fVar10 = 1.0 - fVar63;
            auVar47._4_4_ = fVar10;
            auVar47._0_4_ = fVar10;
            auVar47._8_4_ = fVar10;
            auVar47._12_4_ = fVar10;
            auVar47._16_4_ = fVar10;
            auVar47._20_4_ = fVar10;
            auVar47._24_4_ = fVar10;
            auVar47._28_4_ = fVar10;
            auVar53._0_4_ = fVar63 * *(float *)pauVar20[0xe];
            auVar53._4_4_ = fVar63 * *(float *)(pauVar20[0xe] + 4);
            auVar53._8_4_ = fVar63 * *(float *)(pauVar20[0xe] + 8);
            auVar53._12_4_ = fVar63 * *(float *)(pauVar20[0xe] + 0xc);
            auVar53._16_4_ = fVar63 * *(float *)(pauVar20[0xe] + 0x10);
            auVar53._20_4_ = fVar63 * *(float *)(pauVar20[0xe] + 0x14);
            auVar53._24_4_ = fVar63 * *(float *)(pauVar20[0xe] + 0x18);
            auVar53._28_4_ = 0;
            auVar52._0_4_ = fVar63 * *(float *)pauVar20[0xf];
            auVar52._4_4_ = fVar63 * *(float *)(pauVar20[0xf] + 4);
            auVar52._8_4_ = fVar63 * *(float *)(pauVar20[0xf] + 8);
            auVar52._12_4_ = fVar63 * *(float *)(pauVar20[0xf] + 0xc);
            auVar52._16_4_ = fVar63 * *(float *)(pauVar20[0xf] + 0x10);
            auVar52._20_4_ = fVar63 * *(float *)(pauVar20[0xf] + 0x14);
            auVar52._24_4_ = fVar63 * *(float *)(pauVar20[0xf] + 0x18);
            auVar52._28_4_ = 0;
            auVar72._0_4_ = fVar63 * *(float *)pauVar20[0x10];
            auVar72._4_4_ = fVar63 * *(float *)(pauVar20[0x10] + 4);
            auVar72._8_4_ = fVar63 * *(float *)(pauVar20[0x10] + 8);
            auVar72._12_4_ = fVar63 * *(float *)(pauVar20[0x10] + 0xc);
            auVar72._16_4_ = fVar63 * *(float *)(pauVar20[0x10] + 0x10);
            auVar72._20_4_ = fVar63 * *(float *)(pauVar20[0x10] + 0x14);
            auVar72._28_36_ = auVar81._28_36_;
            auVar72._24_4_ = fVar63 * *(float *)(pauVar20[0x10] + 0x18);
            auVar32 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            auVar40 = vfmadd231ps_avx512vl(auVar53,auVar47,ZEXT1632(auVar32));
            auVar53 = vfmadd231ps_avx512vl(auVar52,auVar47,ZEXT1632(auVar32));
            auVar52 = vfmadd231ps_avx512vl(auVar72._0_32_,auVar47,ZEXT1632(auVar32));
            auVar81 = ZEXT3264(auVar52);
            auVar42 = vmulps_avx512vl(auVar46,pauVar20[0x12]);
            auVar41 = vmulps_avx512vl(auVar46,pauVar20[0x13]);
            auVar82._0_4_ = fVar10 + fVar63 * *(float *)pauVar20[0x11];
            auVar82._4_4_ = fVar10 + fVar63 * *(float *)(pauVar20[0x11] + 4);
            auVar82._8_4_ = fVar10 + fVar63 * *(float *)(pauVar20[0x11] + 8);
            auVar82._12_4_ = fVar10 + fVar63 * *(float *)(pauVar20[0x11] + 0xc);
            auVar82._16_4_ = fVar10 + fVar63 * *(float *)(pauVar20[0x11] + 0x10);
            auVar82._20_4_ = fVar10 + fVar63 * *(float *)(pauVar20[0x11] + 0x14);
            auVar82._24_4_ = fVar10 + fVar63 * *(float *)(pauVar20[0x11] + 0x18);
            auVar82._28_4_ = fVar10 + in_ZMM14._28_4_;
            auVar46 = vaddps_avx512vl(auVar47,auVar42);
            in_ZMM14 = ZEXT3264(auVar46);
            auVar47 = vaddps_avx512vl(auVar47,auVar41);
            auVar44._4_4_ = uVar4;
            auVar44._0_4_ = uVar4;
            auVar44._8_4_ = uVar4;
            auVar44._12_4_ = uVar4;
            auVar44._16_4_ = uVar4;
            auVar44._20_4_ = uVar4;
            auVar44._24_4_ = uVar4;
            auVar44._28_4_ = uVar4;
            auVar42 = vmulps_avx512vl(auVar44,pauVar20[8]);
            auVar41 = vmulps_avx512vl(auVar44,pauVar20[9]);
            auVar43 = vmulps_avx512vl(auVar44,pauVar20[10]);
            auVar54._4_4_ = uVar3;
            auVar54._0_4_ = uVar3;
            auVar54._8_4_ = uVar3;
            auVar54._12_4_ = uVar3;
            auVar54._16_4_ = uVar3;
            auVar54._20_4_ = uVar3;
            auVar54._24_4_ = uVar3;
            auVar54._28_4_ = uVar3;
            auVar42 = vfmadd231ps_avx512vl(auVar42,auVar54,pauVar20[5]);
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar54,pauVar20[6]);
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar54,pauVar20[7]);
            auVar49._4_4_ = uVar2;
            auVar49._0_4_ = uVar2;
            auVar49._8_4_ = uVar2;
            auVar49._12_4_ = uVar2;
            auVar49._16_4_ = uVar2;
            auVar49._20_4_ = uVar2;
            auVar49._24_4_ = uVar2;
            auVar49._28_4_ = uVar2;
            auVar42 = vfmadd231ps_avx512vl(auVar42,auVar49,pauVar20[2]);
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar49,pauVar20[3]);
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar49,pauVar20[4]);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar42,auVar44);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            uVar26 = vcmpps_avx512vl(auVar44,auVar54,1);
            bVar9 = (bool)((byte)uVar26 & 1);
            iVar27 = auVar54._0_4_;
            auVar50._0_4_ = (uint)bVar9 * iVar27 | (uint)!bVar9 * auVar42._0_4_;
            bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
            iVar56 = auVar54._4_4_;
            auVar50._4_4_ = (uint)bVar9 * iVar56 | (uint)!bVar9 * auVar42._4_4_;
            bVar9 = (bool)((byte)(uVar26 >> 2) & 1);
            iVar57 = auVar54._8_4_;
            auVar50._8_4_ = (uint)bVar9 * iVar57 | (uint)!bVar9 * auVar42._8_4_;
            bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
            iVar58 = auVar54._12_4_;
            auVar50._12_4_ = (uint)bVar9 * iVar58 | (uint)!bVar9 * auVar42._12_4_;
            bVar9 = (bool)((byte)(uVar26 >> 4) & 1);
            iVar59 = auVar54._16_4_;
            auVar50._16_4_ = (uint)bVar9 * iVar59 | (uint)!bVar9 * auVar42._16_4_;
            bVar9 = (bool)((byte)(uVar26 >> 5) & 1);
            iVar60 = auVar54._20_4_;
            auVar50._20_4_ = (uint)bVar9 * iVar60 | (uint)!bVar9 * auVar42._20_4_;
            bVar9 = (bool)((byte)(uVar26 >> 6) & 1);
            iVar61 = auVar54._24_4_;
            iVar62 = auVar54._28_4_;
            auVar50._24_4_ = (uint)bVar9 * iVar61 | (uint)!bVar9 * auVar42._24_4_;
            bVar9 = SUB81(uVar26 >> 7,0);
            auVar50._28_4_ = (uint)bVar9 * iVar62 | (uint)!bVar9 * auVar42._28_4_;
            vandps_avx512vl(auVar41,auVar44);
            uVar26 = vcmpps_avx512vl(auVar50,auVar54,1);
            bVar9 = (bool)((byte)uVar26 & 1);
            auVar51._0_4_ = (uint)bVar9 * iVar27 | (uint)!bVar9 * auVar41._0_4_;
            bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar9 * iVar56 | (uint)!bVar9 * auVar41._4_4_;
            bVar9 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar9 * iVar57 | (uint)!bVar9 * auVar41._8_4_;
            bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
            auVar51._12_4_ = (uint)bVar9 * iVar58 | (uint)!bVar9 * auVar41._12_4_;
            bVar9 = (bool)((byte)(uVar26 >> 4) & 1);
            auVar51._16_4_ = (uint)bVar9 * iVar59 | (uint)!bVar9 * auVar41._16_4_;
            bVar9 = (bool)((byte)(uVar26 >> 5) & 1);
            auVar51._20_4_ = (uint)bVar9 * iVar60 | (uint)!bVar9 * auVar41._20_4_;
            bVar9 = (bool)((byte)(uVar26 >> 6) & 1);
            auVar51._24_4_ = (uint)bVar9 * iVar61 | (uint)!bVar9 * auVar41._24_4_;
            bVar9 = SUB81(uVar26 >> 7,0);
            auVar51._28_4_ = (uint)bVar9 * iVar62 | (uint)!bVar9 * auVar41._28_4_;
            vandps_avx512vl(auVar43,auVar44);
            uVar26 = vcmpps_avx512vl(auVar51,auVar54,1);
            bVar9 = (bool)((byte)uVar26 & 1);
            auVar48._0_4_ = (uint)bVar9 * iVar27 | (uint)!bVar9 * auVar43._0_4_;
            bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar9 * iVar56 | (uint)!bVar9 * auVar43._4_4_;
            bVar9 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar9 * iVar57 | (uint)!bVar9 * auVar43._8_4_;
            bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
            auVar48._12_4_ = (uint)bVar9 * iVar58 | (uint)!bVar9 * auVar43._12_4_;
            bVar9 = (bool)((byte)(uVar26 >> 4) & 1);
            auVar48._16_4_ = (uint)bVar9 * iVar59 | (uint)!bVar9 * auVar43._16_4_;
            bVar9 = (bool)((byte)(uVar26 >> 5) & 1);
            auVar48._20_4_ = (uint)bVar9 * iVar60 | (uint)!bVar9 * auVar43._20_4_;
            bVar9 = (bool)((byte)(uVar26 >> 6) & 1);
            auVar48._24_4_ = (uint)bVar9 * iVar61 | (uint)!bVar9 * auVar43._24_4_;
            bVar9 = SUB81(uVar26 >> 7,0);
            auVar48._28_4_ = (uint)bVar9 * iVar62 | (uint)!bVar9 * auVar43._28_4_;
            auVar42 = vrcp14ps_avx512vl(auVar50);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar43 = vfnmadd213ps_avx512vl(auVar50,auVar42,auVar41);
            auVar44 = vfmadd132ps_avx512vl(auVar43,auVar42,auVar42);
            in_ZMM16 = ZEXT3264(auVar44);
            auVar42 = vrcp14ps_avx512vl(auVar51);
            auVar43 = vfnmadd213ps_avx512vl(auVar51,auVar42,auVar41);
            auVar54 = vfmadd132ps_avx512vl(auVar43,auVar42,auVar42);
            auVar43 = vrcp14ps_avx512vl(auVar48);
            auVar41 = vfnmadd213ps_avx512vl(auVar48,auVar43,auVar41);
            auVar42._4_4_ = uVar7;
            auVar42._0_4_ = uVar7;
            auVar42._8_4_ = uVar7;
            auVar42._12_4_ = uVar7;
            auVar42._16_4_ = uVar7;
            auVar42._20_4_ = uVar7;
            auVar42._24_4_ = uVar7;
            auVar42._28_4_ = uVar7;
            auVar49 = vfmadd213ps_avx512vl(pauVar20[8],auVar42,pauVar20[0xb]);
            auVar50 = vfmadd132ps_avx512vl(auVar41,auVar43,auVar43);
            auVar43 = vfmadd213ps_avx512vl(pauVar20[9],auVar42,pauVar20[0xc]);
            auVar42 = vfmadd213ps_avx512vl(pauVar20[10],auVar42,pauVar20[0xd]);
            auVar41._4_4_ = uVar6;
            auVar41._0_4_ = uVar6;
            auVar41._8_4_ = uVar6;
            auVar41._12_4_ = uVar6;
            auVar41._16_4_ = uVar6;
            auVar41._20_4_ = uVar6;
            auVar41._24_4_ = uVar6;
            auVar41._28_4_ = uVar6;
            auVar49 = vfmadd231ps_avx512vl(auVar49,auVar41,pauVar20[5]);
            auVar51 = vfmadd231ps_avx512vl(auVar43,auVar41,pauVar20[6]);
            auVar42 = vfmadd231ps_avx512vl(auVar42,auVar41,pauVar20[7]);
            auVar43._4_4_ = uVar5;
            auVar43._0_4_ = uVar5;
            auVar43._8_4_ = uVar5;
            auVar43._12_4_ = uVar5;
            auVar43._16_4_ = uVar5;
            auVar43._20_4_ = uVar5;
            auVar43._24_4_ = uVar5;
            auVar43._28_4_ = uVar5;
            auVar32 = vfmadd231ps_fma(auVar49,auVar43,pauVar20[2]);
            auVar28 = vfmadd231ps_fma(auVar51,auVar43,pauVar20[3]);
            auVar29 = vfmadd231ps_fma(auVar42,auVar43,pauVar20[4]);
            auVar40 = vsubps_avx(auVar40,ZEXT1632(auVar32));
            auVar42 = vsubps_avx(auVar53,ZEXT1632(auVar28));
            auVar41 = vsubps_avx(auVar52,ZEXT1632(auVar29));
            auVar43 = vmulps_avx512vl(auVar40,auVar44);
            auVar49 = vmulps_avx512vl(auVar42,auVar54);
            auVar53 = vmulps_avx512vl(auVar41,auVar50);
            auVar40 = vsubps_avx(auVar82,ZEXT1632(auVar32));
            auVar42 = vsubps_avx(auVar46,ZEXT1632(auVar28));
            auVar41 = vsubps_avx(auVar47,ZEXT1632(auVar29));
            auVar52 = vmulps_avx512vl(auVar40,auVar44);
            auVar54 = vmulps_avx512vl(auVar42,auVar54);
            auVar46 = vmulps_avx512vl(auVar41,auVar50);
            auVar44 = vpminsd_avx2(auVar43,auVar52);
            auVar40 = vpminsd_avx2(auVar49,auVar54);
            auVar42 = vpminsd_avx2(auVar53,auVar46);
            auVar40 = vmaxps_avx(auVar40,auVar42);
            auVar41 = vpmaxsd_avx2(auVar43,auVar52);
            auVar42 = vpmaxsd_avx2(auVar49,auVar54);
            auVar43 = vpmaxsd_avx2(auVar53,auVar46);
            auVar42 = vminps_avx(auVar42,auVar43);
            auVar43 = vmaxps_avx512vl(auVar36,auVar44);
            auVar40 = vmaxps_avx(auVar43,auVar40);
            auVar41 = vminps_avx(auVar64._0_32_,auVar41);
            auVar42 = vminps_avx(auVar41,auVar42);
            uVar26 = vcmpps_avx512vl(auVar40,auVar42,2);
          }
          else {
            auVar66._4_4_ = fVar63;
            auVar66._0_4_ = fVar63;
            auVar66._8_4_ = fVar63;
            auVar66._12_4_ = fVar63;
            auVar66._16_4_ = fVar63;
            auVar66._20_4_ = fVar63;
            auVar66._24_4_ = fVar63;
            auVar66._28_4_ = fVar63;
            auVar32 = vfmadd213ps_fma(pauVar20[uVar25 + 8],auVar66,pauVar20[uVar25 + 2]);
            auVar41 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar33,auVar37);
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + uVar23),auVar66,
                                      *(undefined1 (*) [32])(pauVar20[2] + uVar23));
            auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + uVar24),auVar66,
                                      *(undefined1 (*) [32])(pauVar20[2] + uVar24));
            auVar40 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar34,auVar38);
            auVar42 = vfmadd213ps_avx512vl(ZEXT1632(auVar28),auVar35,auVar39);
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + uVar21),auVar66,
                                      *(undefined1 (*) [32])(pauVar20[2] + uVar21));
            auVar40 = vmaxps_avx(auVar40,auVar42);
            auVar43 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar33,auVar37);
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + (uVar23 ^ 0x20)),auVar66,
                                      *(undefined1 (*) [32])(pauVar20[2] + (uVar23 ^ 0x20)));
            auVar42 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar34,auVar38);
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + (uVar24 ^ 0x20)),auVar66,
                                      *(undefined1 (*) [32])(pauVar20[2] + (uVar24 ^ 0x20)));
            auVar44 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar35,auVar39);
            auVar42 = vminps_avx(auVar42,auVar44);
            auVar41 = vmaxps_avx512vl(auVar36,auVar41);
            auVar40 = vmaxps_avx(auVar41,auVar40);
            auVar41 = vminps_avx(auVar64._0_32_,auVar43);
            auVar42 = vminps_avx(auVar41,auVar42);
            uVar26 = vcmpps_avx512vl(auVar40,auVar42,2);
            if (uVar17 == 6) {
              uVar12 = vcmpps_avx512vl(auVar66,pauVar20[0xe],0xd);
              uVar13 = vcmpps_avx512vl(auVar66,pauVar20[0xf],1);
              uVar26 = uVar26 & uVar12 & uVar13;
            }
          }
          bVar16 = (byte)uVar26;
          if (bVar16 == 0) goto LAB_01f15736;
          auVar42 = *pauVar20;
          auVar41 = pauVar20[1];
          auVar43 = vmovdqa64_avx512vl(auVar83._0_32_);
          auVar43 = vpternlogd_avx512vl(auVar43,auVar40,auVar84._0_32_,0xf8);
          auVar44 = vpcompressd_avx512vl(auVar43);
          auVar45._0_4_ =
               (uint)(bVar16 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar43._0_4_;
          bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar45._4_4_ = (uint)bVar9 * auVar44._4_4_ | (uint)!bVar9 * auVar43._4_4_;
          bVar9 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar45._8_4_ = (uint)bVar9 * auVar44._8_4_ | (uint)!bVar9 * auVar43._8_4_;
          bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar45._12_4_ = (uint)bVar9 * auVar44._12_4_ | (uint)!bVar9 * auVar43._12_4_;
          bVar9 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar45._16_4_ = (uint)bVar9 * auVar44._16_4_ | (uint)!bVar9 * auVar43._16_4_;
          bVar9 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar45._20_4_ = (uint)bVar9 * auVar44._20_4_ | (uint)!bVar9 * auVar43._20_4_;
          bVar9 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar45._24_4_ = (uint)bVar9 * auVar44._24_4_ | (uint)!bVar9 * auVar43._24_4_;
          bVar9 = SUB81(uVar26 >> 7,0);
          auVar45._28_4_ = (uint)bVar9 * auVar44._28_4_ | (uint)!bVar9 * auVar43._28_4_;
          auVar43 = vpermt2q_avx512vl(auVar42,auVar45,auVar41);
          uVar26 = auVar43._0_8_;
          bVar16 = bVar16 - 1 & bVar16;
          if (bVar16 != 0) {
            auVar43 = vpshufd_avx2(auVar45,0x55);
            vpermt2q_avx512vl(auVar42,auVar43,auVar41);
            auVar44 = vpminsd_avx2(auVar45,auVar43);
            auVar43 = vpmaxsd_avx2(auVar45,auVar43);
            bVar16 = bVar16 - 1 & bVar16;
            if (bVar16 == 0) {
              auVar44 = vpermi2q_avx512vl(auVar44,auVar42,auVar41);
              uVar26 = auVar44._0_8_;
              auVar42 = vpermt2q_avx512vl(auVar42,auVar43,auVar41);
              *puVar22 = auVar42._0_8_;
              auVar40 = vpermd_avx2(auVar43,auVar40);
              *(int *)(puVar22 + 1) = auVar40._0_4_;
              puVar22 = puVar22 + 2;
            }
            else {
              auVar49 = vpshufd_avx2(auVar45,0xaa);
              vpermt2q_avx512vl(auVar42,auVar49,auVar41);
              auVar54 = vpminsd_avx2(auVar44,auVar49);
              auVar44 = vpmaxsd_avx2(auVar44,auVar49);
              auVar49 = vpminsd_avx2(auVar43,auVar44);
              auVar43 = vpmaxsd_avx2(auVar43,auVar44);
              bVar16 = bVar16 - 1 & bVar16;
              if (bVar16 == 0) {
                auVar44 = vpermi2q_avx512vl(auVar54,auVar42,auVar41);
                uVar26 = auVar44._0_8_;
                auVar44 = vpermt2q_avx512vl(auVar42,auVar43,auVar41);
                *puVar22 = auVar44._0_8_;
                auVar43 = vpermd_avx2(auVar43,auVar40);
                *(int *)(puVar22 + 1) = auVar43._0_4_;
                auVar42 = vpermt2q_avx512vl(auVar42,auVar49,auVar41);
                puVar22[2] = auVar42._0_8_;
                auVar40 = vpermd_avx2(auVar49,auVar40);
                *(int *)(puVar22 + 3) = auVar40._0_4_;
                puVar22 = puVar22 + 4;
              }
              else {
                auVar44 = vpshufd_avx2(auVar45,0xff);
                vpermt2q_avx512vl(auVar42,auVar44,auVar41);
                auVar53 = vpminsd_avx2(auVar54,auVar44);
                auVar44 = vpmaxsd_avx2(auVar54,auVar44);
                auVar54 = vpminsd_avx2(auVar49,auVar44);
                auVar44 = vpmaxsd_avx2(auVar49,auVar44);
                auVar49 = vpminsd_avx2(auVar43,auVar44);
                auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                bVar16 = bVar16 - 1 & bVar16;
                if (bVar16 == 0) {
                  auVar44 = vpermi2q_avx512vl(auVar53,auVar42,auVar41);
                  uVar26 = auVar44._0_8_;
                  auVar44 = vpermt2q_avx512vl(auVar42,auVar43,auVar41);
                  *puVar22 = auVar44._0_8_;
                  auVar43 = vpermd_avx2(auVar43,auVar40);
                  *(int *)(puVar22 + 1) = auVar43._0_4_;
                  auVar43 = vpermt2q_avx512vl(auVar42,auVar49,auVar41);
                  puVar22[2] = auVar43._0_8_;
                  auVar43 = vpermd_avx2(auVar49,auVar40);
                  *(int *)(puVar22 + 3) = auVar43._0_4_;
                  auVar42 = vpermt2q_avx512vl(auVar42,auVar54,auVar41);
                  puVar22[4] = auVar42._0_8_;
                  auVar40 = vpermd_avx2(auVar54,auVar40);
                  *(int *)(puVar22 + 5) = auVar40._0_4_;
                  puVar22 = puVar22 + 6;
                }
                else {
                  auVar52 = valignd_avx512vl(auVar45,auVar45,3);
                  auVar44 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar81 = ZEXT3264(auVar44);
                  auVar53 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar44,auVar53);
                  auVar44 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar54 = vpermt2d_avx512vl(auVar53,auVar44,auVar54);
                  auVar54 = vpermt2d_avx512vl(auVar54,auVar44,auVar49);
                  auVar44 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar43 = vpermt2d_avx512vl(auVar54,auVar44,auVar43);
                  auVar72 = ZEXT3264(auVar43);
                  bVar19 = bVar16;
                  do {
                    auVar44 = auVar72._0_32_;
                    auVar71._8_4_ = 1;
                    auVar71._0_8_ = 0x100000001;
                    auVar71._12_4_ = 1;
                    auVar71._16_4_ = 1;
                    auVar71._20_4_ = 1;
                    auVar71._24_4_ = 1;
                    auVar71._28_4_ = 1;
                    auVar43 = vpermd_avx2(auVar71,auVar52);
                    auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                    vpermt2q_avx512vl(auVar42,auVar52,auVar41);
                    bVar19 = bVar19 - 1 & bVar19;
                    uVar11 = vpcmpd_avx512vl(auVar43,auVar44,5);
                    auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                    bVar14 = (byte)uVar11 << 1;
                    auVar44 = valignd_avx512vl(auVar44,auVar44,7);
                    bVar9 = (bool)((byte)uVar11 & 1);
                    auVar55._4_4_ = (uint)bVar9 * auVar44._4_4_ | (uint)!bVar9 * auVar43._4_4_;
                    auVar55._0_4_ = auVar43._0_4_;
                    bVar9 = (bool)(bVar14 >> 2 & 1);
                    auVar55._8_4_ = (uint)bVar9 * auVar44._8_4_ | (uint)!bVar9 * auVar43._8_4_;
                    bVar9 = (bool)(bVar14 >> 3 & 1);
                    auVar55._12_4_ = (uint)bVar9 * auVar44._12_4_ | (uint)!bVar9 * auVar43._12_4_;
                    bVar9 = (bool)(bVar14 >> 4 & 1);
                    auVar55._16_4_ = (uint)bVar9 * auVar44._16_4_ | (uint)!bVar9 * auVar43._16_4_;
                    bVar9 = (bool)(bVar14 >> 5 & 1);
                    auVar55._20_4_ = (uint)bVar9 * auVar44._20_4_ | (uint)!bVar9 * auVar43._20_4_;
                    bVar9 = (bool)(bVar14 >> 6 & 1);
                    auVar55._24_4_ = (uint)bVar9 * auVar44._24_4_ | (uint)!bVar9 * auVar43._24_4_;
                    auVar55._28_4_ =
                         (uint)(bVar14 >> 7) * auVar44._28_4_ |
                         (uint)!(bool)(bVar14 >> 7) * auVar43._28_4_;
                    auVar72 = ZEXT3264(auVar55);
                  } while (bVar19 != 0);
                  lVar18 = (ulong)(uint)POPCOUNT((uint)bVar16) + 3;
                  do {
                    auVar43 = vpermi2q_avx512vl(auVar55,auVar42,auVar41);
                    *puVar22 = auVar43._0_8_;
                    auVar44 = auVar72._0_32_;
                    auVar43 = vpermd_avx2(auVar44,auVar40);
                    *(int *)(puVar22 + 1) = auVar43._0_4_;
                    auVar55 = valignd_avx512vl(auVar44,auVar44,1);
                    puVar22 = puVar22 + 2;
                    auVar72 = ZEXT3264(auVar55);
                    lVar18 = lVar18 + -1;
                  } while (lVar18 != 0);
                  auVar40 = vpermt2q_avx512vl(auVar42,auVar55,auVar41);
                  uVar26 = auVar40._0_8_;
                }
              }
            }
          }
        }
        auVar81 = ZEXT1664(auVar81._0_16_);
        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(uVar26 & 0xfffffffffffffff0) * 0x40))(local_23b8,ray,context);
        auVar40 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
        auVar84 = ZEXT3264(auVar40);
        auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
        auVar83 = ZEXT3264(auVar40);
        fVar63 = (ray->super_RayK<1>).tfar;
        auVar64 = ZEXT3264(CONCAT428(fVar63,CONCAT424(fVar63,CONCAT420(fVar63,CONCAT416(fVar63,
                                                  CONCAT412(fVar63,CONCAT48(fVar63,CONCAT44(fVar63,
                                                  fVar63))))))));
      }
LAB_01f15736:
    } while (puVar22 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }